

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O3

void __thiscall
Simulator::saveData(Simulator *this,ofstream *state_data,ofstream *control_input_data,
                   ofstream *error_data,double time_param,VectorXd *state_vec,
                   VectorXd *control_input_vec,double optimality_error)

{
  int iVar1;
  ostream *poVar2;
  NMPCModel *this_00;
  long lVar3;
  
  this_00 = &this->model_;
  iVar1 = NMPCModel::dimState(this_00);
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      if ((state_vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows <= lVar3) goto LAB_001063cd;
      poVar2 = std::ostream::_M_insert<double>
                         ((state_vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                          ).m_storage.m_data[lVar3]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      lVar3 = lVar3 + 1;
      iVar1 = NMPCModel::dimState(this_00);
    } while (lVar3 < iVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)state_data,"\n",1);
  iVar1 = NMPCModel::dimControlInput(this_00);
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      if ((control_input_vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
          m_storage.m_rows <= lVar3) {
LAB_001063cd:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                     );
      }
      poVar2 = std::ostream::_M_insert<double>
                         ((control_input_vec->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                          m_data[lVar3]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      lVar3 = lVar3 + 1;
      iVar1 = NMPCModel::dimControlInput(this_00);
    } while (lVar3 < iVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)control_input_data,"\n",1);
  poVar2 = std::ostream::_M_insert<double>(optimality_error);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  return;
}

Assistant:

void Simulator::saveData(std::ofstream& state_data, std::ofstream& control_input_data, std::ofstream& error_data, const double time_param, const Eigen::VectorXd& state_vec, const Eigen::VectorXd& control_input_vec, const double optimality_error)
{
    for(int i=0; i<model_.dimState(); i++){
        state_data << state_vec(i) << " ";
    }
    state_data << "\n";

    for(int i=0; i<model_.dimControlInput(); i++){
        control_input_data << control_input_vec(i) << " ";
    }
    control_input_data << "\n";

    error_data << optimality_error << "\n";
}